

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscribedsignal.cpp
# Opt level: O3

size_t __thiscall
hbm::streaming::SubscribedSignal::processMeasuredData
          (SubscribedSignal *this,uchar *pData,size_t size,DataAsDoubleCb_t *cbDouble,
          DataAsRawCb_t *cbRaw)

{
  pattern_t pVar1;
  ulong uVar2;
  ulong uVar3;
  uint64_t __args_1;
  size_t sVar4;
  unsigned_long uVar5;
  long lVar6;
  size_t count;
  uchar *pData_00;
  
  pVar1 = this->m_dataFormatPattern;
  if (pVar1 == PATTERN_TB) {
    sVar4 = this->m_dataTimeSize;
    if (this->m_dataValueSize + sVar4 <= size) {
      uVar3 = (size - sVar4) / this->m_dataValueSize;
      count = 0x80;
      if (uVar3 < 0x80) {
        count = uVar3;
      }
      uVar5 = 0;
      if (this->m_dataTimeType == TIMETYPE_NTP) {
        uVar3 = *(ulong *)pData;
        uVar5 = uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 |
                (uVar3 & 0xff0000000000) >> 0x18 | (uVar3 & 0xff00000000) >> 8 |
                (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18 | (uVar3 & 0xff00) << 0x28 |
                uVar3 << 0x38;
        if (this->m_dataIsBigEndian == false) {
          uVar5 = uVar3;
        }
      }
      if ((cbDouble->super__Function_base)._M_manager != (_Manager_type)0x0) {
        interpretValuesAsDouble(this,pData + sVar4,count);
        std::
        function<void_(hbm::streaming::SubscribedSignal_&,_unsigned_long,_const_double_*,_unsigned_long)>
        ::operator()(cbDouble,this,uVar5,this->m_valueBuffer,count);
        sVar4 = this->m_dataTimeSize;
      }
      if ((cbRaw->super__Function_base)._M_manager != (_Manager_type)0x0) {
        std::
        function<void_(hbm::streaming::SubscribedSignal_&,_unsigned_long,_const_unsigned_char_*,_unsigned_long)>
        ::operator()(cbRaw,this,uVar5 + sVar4,pData,size - sVar4);
        sVar4 = this->m_dataTimeSize;
      }
      return count * this->m_dataValueSize + sVar4;
    }
  }
  else if (pVar1 == PATTERN_TV) {
    sVar4 = this->m_dataValueSize;
    uVar3 = this->m_dataTimeSize + sVar4;
    if (uVar3 <= size) {
      lVar6 = 0;
      do {
        if (this->m_dataTimeType == TIMETYPE_NTP) {
          uVar2 = *(ulong *)pData;
          uVar5 = uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 |
                  (uVar2 & 0xff0000000000) >> 0x18 | (uVar2 & 0xff00000000) >> 8 |
                  (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 | (uVar2 & 0xff00) << 0x28
                  | uVar2 << 0x38;
          if (this->m_dataIsBigEndian == false) {
            uVar5 = uVar2;
          }
        }
        else {
          uVar5 = 0;
        }
        pData_00 = (uchar *)((long)pData + this->m_dataTimeSize);
        if ((cbDouble->super__Function_base)._M_manager != (_Manager_type)0x0) {
          interpretValuesAsDouble(this,pData_00,1);
          std::
          function<void_(hbm::streaming::SubscribedSignal_&,_unsigned_long,_const_double_*,_unsigned_long)>
          ::operator()(cbDouble,this,uVar5,this->m_valueBuffer,1);
          sVar4 = this->m_dataValueSize;
        }
        if ((cbRaw->super__Function_base)._M_manager != (_Manager_type)0x0) {
          std::
          function<void_(hbm::streaming::SubscribedSignal_&,_unsigned_long,_const_unsigned_char_*,_unsigned_long)>
          ::operator()(cbRaw,this,uVar5,pData_00,sVar4);
          sVar4 = this->m_dataValueSize;
        }
        pData = pData_00 + sVar4;
        lVar6 = lVar6 - uVar3;
      } while (uVar3 <= size + lVar6);
      return -lVar6;
    }
  }
  else if (pVar1 == PATTERN_V) {
    uVar3 = size / this->m_dataValueSize;
    sVar4 = 0x80;
    if ((0x80 < uVar3) || (sVar4 = uVar3, this->m_dataValueSize <= size)) {
      __args_1 = deltaTimeInfo::increment(&this->m_syncSignalTime,(uint)sVar4);
      if ((cbDouble->super__Function_base)._M_manager != (_Manager_type)0x0) {
        interpretValuesAsDouble(this,pData,sVar4);
        std::
        function<void_(hbm::streaming::SubscribedSignal_&,_unsigned_long,_const_double_*,_unsigned_long)>
        ::operator()(cbDouble,this,__args_1,this->m_valueBuffer,sVar4);
      }
      if ((cbRaw->super__Function_base)._M_manager != (_Manager_type)0x0) {
        std::
        function<void_(hbm::streaming::SubscribedSignal_&,_unsigned_long,_const_unsigned_char_*,_unsigned_long)>
        ::operator()(cbRaw,this,__args_1,pData,size);
      }
      return sVar4 * this->m_dataValueSize;
    }
  }
  return 0;
}

Assistant:

size_t SubscribedSignal::processMeasuredData(unsigned char* pData, size_t size, DataAsDoubleCb_t cbDouble, DataAsRawCb_t cbRaw)
		{
			size_t bytesProcessed = 0;

			switch(m_dataFormatPattern) {
			case PATTERN_V:
				{
					size_t valueCount = size / m_dataValueSize;
					if (valueCount > m_valueBufferMaxValues) {
						valueCount = m_valueBufferMaxValues;
					} else if (valueCount == 0) {
						break;
					}
					uint64_t timeStamp = m_syncSignalTime.increment(valueCount);
					if (cbDouble) {
						interpretValuesAsDouble(pData, valueCount);
						cbDouble(*this, timeStamp, m_valueBuffer, valueCount);
					}

					if (cbRaw) {
						cbRaw(*this, timeStamp, pData, size);
					}
					bytesProcessed = valueCount * m_dataValueSize;
				}
				break;
			case PATTERN_TV:
				{
					// 1 time stamp, 1 value
					size_t tupleSize = m_dataTimeSize+m_dataValueSize;
					while (size>=tupleSize) {
						uint64_t ntpTimeStamp = interpreteNtpTimestamp(pData);
						pData += m_dataTimeSize;
						if (cbDouble) {
							interpretValuesAsDouble(pData, 1);
							cbDouble(*this, ntpTimeStamp, m_valueBuffer, 1);
						}

						if (cbRaw) {
							cbRaw(*this, ntpTimeStamp, pData, m_dataValueSize);
						}

						pData += m_dataValueSize;
						size -= tupleSize;
						bytesProcessed += tupleSize;
					}
				}
				break;
			case PATTERN_TB:
				// 1 time stamp n values
				size_t tupleSize = m_dataTimeSize+m_dataValueSize;
				if(size>=tupleSize) {
					size_t valueCount = (size-m_dataTimeSize) / m_dataValueSize;
					if(valueCount>m_valueBufferMaxValues) {
						valueCount=m_valueBufferMaxValues;
					}
					uint64_t ntpTimeStamp = interpreteNtpTimestamp(pData);
					if (cbDouble) {
						interpretValuesAsDouble(pData+m_dataTimeSize, valueCount);
						cbDouble(*this, ntpTimeStamp, m_valueBuffer, valueCount);
					}

					if (cbRaw) {
						cbRaw(*this, ntpTimeStamp+m_dataTimeSize, pData, size-m_dataTimeSize);
					}


					bytesProcessed = m_dataTimeSize + (m_dataValueSize*valueCount);
				}
				break;
			}
			return bytesProcessed;
		}